

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void Js::JavascriptOperators::PatchPutRootValueNoLocalFastPath<false,Js::InlineCache>
               (FunctionBody *functionBody,InlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId,Var newValue,
               PropertyOperationFlags flags)

{
  ImplicitCallFlags *pIVar1;
  Type TVar2;
  undefined8 propertyValue;
  bool bVar3;
  ImplicitCallFlags IVar4;
  ImplicitCallFlags IVar5;
  BOOL BVar6;
  ScriptContext *requestContext;
  RecyclableObject *object;
  undefined1 local_a0 [8];
  PropertyValueInfo info;
  
  info._56_8_ = newValue;
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  object = VarTo<Js::RecyclableObject>(instance);
  propertyValue = info._56_8_;
  local_a0 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_a0,functionBody,inlineCache,inlineCacheIndex,true);
  bVar3 = CacheOperators::TrySetProperty<true,true,true,true,false,true,false,false>
                    (object,true,propertyId,(Var)propertyValue,requestContext,flags,
                     (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_a0);
  if (!bVar3) {
    bVar3 = Phases::IsEnabled((Phases *)&DAT_01453738,InlineCachePhase);
    if ((bVar3) && (DAT_0145948a == '\x01')) {
      CacheOperators::TraceCache
                (inlineCache,L"PatchPutRootValueNoLocalFastPath",propertyId,requestContext,object);
    }
    TVar2 = (functionBody->super_ParseableFunctionInfo).flags;
    IVar4 = ImplicitCall_None;
    if ((TVar2 & Flags_HasOnlyThisStatements) != Flags_None) {
      IVar4 = CacheAndClearImplicitBit(requestContext);
    }
    BVar6 = SetRootProperty(object,propertyId,(Var)propertyValue,(PropertyValueInfo *)local_a0,
                            requestContext,flags);
    if (BVar6 == 0) {
      pIVar1 = &requestContext->threadContext->implicitCallFlags;
      *pIVar1 = *pIVar1 | ImplicitCall_NoOpSet;
    }
    if ((TVar2 & Flags_HasOnlyThisStatements) != Flags_None) {
      IVar5 = CheckAndUpdateFunctionBodyWithImplicitFlag(functionBody);
      requestContext->threadContext->implicitCallFlags = IVar5 | IVar4;
    }
  }
  return;
}

Assistant:

inline void JavascriptOperators::PatchPutRootValueNoLocalFastPath(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId, Var newValue, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchPutRootValueNoLocalFastPath);
        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        RecyclableObject *object = VarTo<RecyclableObject>(instance);

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        if (CacheOperators::TrySetProperty<!TInlineCache::IsPolymorphic, true, true, true, false, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false>(
                object, true, propertyId, newValue, scriptContext, flags, nullptr, &info))
        {
            return;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchPutRootValueNoLocalFastPath"), propertyId, scriptContext, object);
        }
#endif

        ImplicitCallFlags prevImplicitCallFlags = ImplicitCall_None;
        ImplicitCallFlags currImplicitCallFlags = ImplicitCall_None;
        bool hasThisOnlyStatements = functionBody->GetHasOnlyThisStmts();
        if (hasThisOnlyStatements)
        {
            prevImplicitCallFlags = CacheAndClearImplicitBit(scriptContext);
        }
        if (!JavascriptOperators::SetRootProperty(object, propertyId, newValue, &info, scriptContext, flags))
        {
            // Add implicit call flags, to bail out if field copy prop may propagate the wrong value.
            scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
        }
        if (hasThisOnlyStatements)
        {
            currImplicitCallFlags = CheckAndUpdateFunctionBodyWithImplicitFlag(functionBody);
            RestoreImplicitFlag(scriptContext, prevImplicitCallFlags, currImplicitCallFlags);
        }
        JIT_HELPER_END(Op_PatchPutRootValueNoLocalFastPath);
    }